

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall
adios2sys::RegularExpression::find
          (RegularExpression *this,char *string,RegularExpressionMatch *rmatch)

{
  int iVar1;
  char **ppcVar2;
  RegExpFind *this_00;
  RegularExpressionMatch *in_RDX;
  RegExpFind *in_RSI;
  long in_RDI;
  RegExpFind regFind;
  char *s;
  char *in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  RegExpFind *pRVar3;
  bool local_1;
  
  RegularExpressionMatch::clear(in_RDX);
  in_RDX->searchstring = (char *)in_RSI;
  if (*(long *)(in_RDI + 0x220) == 0) {
    local_1 = false;
  }
  else if (**(char **)(in_RDI + 0x220) == -100) {
    this_00 = in_RSI;
    if (*(long *)(in_RDI + 0x210) != 0) {
      while ((in_stack_ffffffffffffffd8 =
                   (char **)strchr((char *)in_RSI,(int)**(char **)(in_RDI + 0x210)),
             in_stack_ffffffffffffffd8 != (char **)0x0 &&
             (iVar1 = strncmp((char *)in_stack_ffffffffffffffd8,*(char **)(in_RDI + 0x210),
                              *(size_t *)(in_RDI + 0x218)), iVar1 != 0))) {
        in_RSI = (RegExpFind *)((long)in_stack_ffffffffffffffd8 + 1);
      }
      if (in_stack_ffffffffffffffd8 == (char **)0x0) {
        return false;
      }
    }
    if (*(char *)(in_RDI + 0x209) == '\0') {
      pRVar3 = this_00;
      if (*(char *)(in_RDI + 0x208) == '\0') {
        do {
          iVar1 = RegExpFind::regtry(pRVar3,(char *)in_RDX,&this_00->reginput,
                                     in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          if (iVar1 != 0) {
            return true;
          }
          ppcVar2 = &this_00->reginput;
          this_00 = (RegExpFind *)((long)&this_00->reginput + 1);
        } while (*(char *)ppcVar2 != '\0');
      }
      else {
        while (ppcVar2 = (char **)strchr((char *)this_00,(int)*(char *)(in_RDI + 0x208)),
              ppcVar2 != (char **)0x0) {
          iVar1 = RegExpFind::regtry(pRVar3,(char *)in_RDX,ppcVar2,in_stack_ffffffffffffffd0,
                                     in_stack_ffffffffffffffc8);
          if (iVar1 != 0) {
            return true;
          }
          this_00 = (RegExpFind *)((long)ppcVar2 + 1);
        }
      }
      local_1 = false;
    }
    else {
      iVar1 = RegExpFind::regtry(this_00,(char *)in_RDX,in_stack_ffffffffffffffd8,
                                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      local_1 = iVar1 != 0;
    }
  }
  else {
    printf("RegularExpression::find(): Compiled regular expression corrupted.\n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RegularExpression::find(char const* string,
                             RegularExpressionMatch& rmatch) const
{
  const char* s;

  rmatch.clear();
  rmatch.searchstring = string;

  if (!this->program) {
    return false;
  }

  // Check validity of program.
  if (UCHARAT(this->program) != MAGIC) {
    // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf(
      "RegularExpression::find(): Compiled regular expression corrupted.\n");
    return false;
  }

  // If there is a "must appear" string, look for it.
  if (this->regmust) {
    s = string;
    while ((s = strchr(s, this->regmust[0]))) {
      if (strncmp(s, this->regmust, this->regmlen) == 0)
        break; // Found it.
      s++;
    }
    if (!s) // Not present.
      return false;
  }

  RegExpFind regFind;

  // Mark beginning of line for ^ .
  regFind.regbol = string;

  // Simplest case:  anchored match need be tried only once.
  if (this->reganch)
    return (
      regFind.regtry(string, rmatch.startp, rmatch.endp, this->program) != 0);

  // Messy cases:  unanchored match.
  s = string;
  if (this->regstart != '\0')
    // We know what char it must start with.
    while ((s = strchr(s, this->regstart))) {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
      s++;
    }
  else
    // We don't -- general case.
    do {
      if (regFind.regtry(s, rmatch.startp, rmatch.endp, this->program))
        return true;
    } while (*s++ != '\0');

  // Failure.
  return false;
}